

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIComboBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIComboBox::openCloseMenu(CGUIComboBox *this)

{
  uint uVar1;
  int iVar2;
  u32 uVar3;
  undefined4 extraout_var;
  vector2d<int> vVar4;
  void *pvVar5;
  undefined4 extraout_var_00;
  wchar_t *pwVar6;
  IGUIElement *in_RDI;
  rect<int> rVar7;
  s32 i;
  rect<int> r;
  u32 h;
  IGUISkin *skin;
  SEvent event;
  undefined4 uVar8;
  u32 in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  int y2;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  int y;
  int in_stack_ffffffffffffff0c;
  rect<int> *in_stack_ffffffffffffff10;
  long *plVar9;
  int local_b8;
  rect<int> in_stack_ffffffffffffff4c;
  s32 in_stack_ffffffffffffff5c;
  IGUIElement *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  CGUIListBox *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7c [12];
  int iStack_78;
  undefined4 local_40 [4];
  undefined8 local_30;
  undefined4 local_28;
  
  if (*(long *)&in_RDI->field_0x148 == 0) {
    if (in_RDI->Parent != (IGUIElement *)0x0) {
      local_40[0] = 0;
      local_30 = 0;
      local_28 = 8;
      uVar1 = (*(in_RDI->Parent->super_IEventReceiver)._vptr_IEventReceiver[2])
                        (in_RDI->Parent,local_40);
      if ((uVar1 & 1) != 0) {
        return;
      }
      (*(in_RDI->Parent->super_IEventReceiver)._vptr_IEventReceiver[0x1a])();
    }
    iVar2 = (*in_RDI->Environment->_vptr_IGUIEnvironment[0xc])();
    uVar3 = core::array<irr::gui::CGUIComboBox::SComboData>::size
                      ((array<irr::gui::CGUIComboBox::SComboData> *)0x3a1b74);
    uVar1 = (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x30])();
    if (uVar1 < uVar3) {
      (*(in_RDI->super_IEventReceiver)._vptr_IEventReceiver[0x30])();
    }
    vVar4 = (vector2d<int>)
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))
                      ((long *)CONCAT44(extraout_var,iVar2),0);
    in_RDI[1].AbsoluteRect.UpperLeftCorner = vVar4;
    if (in_RDI[1].AbsoluteRect.UpperLeftCorner != (vector2d<int>)0x0) {
      vVar4 = in_RDI[1].AbsoluteRect.UpperLeftCorner;
      (**(code **)(*(long *)vVar4 + 8))(vVar4,L"A");
    }
    core::rect<int>::getHeight(&in_RDI->AbsoluteRect);
    core::rect<int>::getWidth(&in_RDI->AbsoluteRect);
    core::rect<int>::getHeight(&in_RDI->AbsoluteRect);
    core::rect<int>::rect
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
    pvVar5 = operator_new(0x1d0);
    uVar8 = 0;
    y2 = 1;
    y = 1;
    rVar7.UpperLeftCorner.Y = in_stack_ffffffffffffff7c._0_4_;
    rVar7.LowerRightCorner.X = (int)in_stack_ffffffffffffff7c._4_8_;
    rVar7.LowerRightCorner.Y = (int)((ulong)in_stack_ffffffffffffff7c._4_8_ >> 0x20);
    rVar7.UpperLeftCorner.X = in_stack_ffffffffffffff78;
    CGUIListBox::CGUIListBox
              (in_stack_ffffffffffffff70,
               (IGUIEnvironment *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,rVar7,
               in_stack_ffffffffffffff4c.LowerRightCorner.Y._3_1_,
               in_stack_ffffffffffffff4c.LowerRightCorner.Y._2_1_,
               in_stack_ffffffffffffff4c.LowerRightCorner.Y._1_1_);
    *(void **)&in_RDI->field_0x148 = pvVar5;
    (**(code **)(**(long **)&in_RDI->field_0x148 + 0x88))(*(long **)&in_RDI->field_0x148,1);
    IGUIElement::setNotClipped
              ((IGUIElement *)CONCAT44(in_stack_ffffffffffffff04,y2),
               SUB41(in_stack_fffffffffffffefc >> 0x18,0));
    IReferenceCounted::drop((IReferenceCounted *)CONCAT44(in_stack_fffffffffffffefc,uVar8));
    rVar7 = IGUIElement::getAbsolutePosition(*(IGUIElement **)&in_RDI->field_0x148);
    iStack_78 = rVar7.LowerRightCorner.Y;
    iVar2 = (*in_RDI->Environment->_vptr_IGUIEnvironment[0x16])();
    IGUIElement::getAbsolutePosition((IGUIElement *)CONCAT44(extraout_var_00,iVar2));
    iVar2 = core::rect<int>::getHeight((rect<int> *)&stack0xffffffffffffff6c);
    if (iVar2 < iStack_78) {
      IGUIElement::getAbsolutePosition(*(IGUIElement **)&in_RDI->field_0x148);
      core::rect<int>::getHeight((rect<int> *)&stack0xffffffffffffff4c);
      core::rect<int>::getWidth(&in_RDI->AbsoluteRect);
      core::rect<int>::rect
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,y,in_stack_ffffffffffffff04,y2)
      ;
      IGUIElement::setRelativePosition(in_RDI,(rect<int> *)CONCAT44(uVar3,iStack_78));
    }
    for (local_b8 = 0;
        uVar3 = core::array<irr::gui::CGUIComboBox::SComboData>::size
                          ((array<irr::gui::CGUIComboBox::SComboData> *)0x3a1e3d),
        local_b8 < (int)uVar3; local_b8 = local_b8 + 1) {
      plVar9 = *(long **)&in_RDI->field_0x148;
      core::array<irr::gui::CGUIComboBox::SComboData>::operator[]
                ((array<irr::gui::CGUIComboBox::SComboData> *)CONCAT44(in_stack_ffffffffffffff04,y2)
                 ,in_stack_fffffffffffffefc);
      pwVar6 = core::string<wchar_t>::c_str((string<wchar_t> *)0x3a1e70);
      (**(code **)(*plVar9 + 0x130))(plVar9,pwVar6);
    }
    (**(code **)(**(long **)&in_RDI->field_0x148 + 0x170))
              (*(long **)&in_RDI->field_0x148,*(undefined4 *)&in_RDI[1].ParentPos._M_node);
    (*in_RDI->Environment->_vptr_IGUIEnvironment[1])
              (in_RDI->Environment,*(undefined8 *)&in_RDI->field_0x148);
  }
  else {
    (*in_RDI->Environment->_vptr_IGUIEnvironment[1])();
    (**(code **)(**(long **)&in_RDI->field_0x148 + 0x48))();
    *(undefined8 *)&in_RDI->field_0x148 = 0;
  }
  return;
}

Assistant:

void CGUIComboBox::openCloseMenu()
{
	if (ListBox) {
		// close list box
		Environment->setFocus(this);
		ListBox->remove();
		ListBox = nullptr;
	} else {
		if (Parent) {
			SEvent event;
			event.EventType = EET_GUI_EVENT;
			event.GUIEvent.Caller = this;
			event.GUIEvent.Element = nullptr;
			event.GUIEvent.EventType = EGET_LISTBOX_OPENED;

			// Allow to prevent the listbox from opening.
			if (Parent->OnEvent(event))
				return;

			Parent->bringToFront(this);
		}

		IGUISkin *skin = Environment->getSkin();
		u32 h = Items.size();

		if (h > getMaxSelectionRows())
			h = getMaxSelectionRows();
		if (h == 0)
			h = 1;

		ActiveFont = skin->getFont();
		if (ActiveFont)
			h *= (ActiveFont->getDimension(L"A").Height + 4);

		// open list box
		core::rect<s32> r(0, AbsoluteRect.getHeight(),
				AbsoluteRect.getWidth(), AbsoluteRect.getHeight() + h);

		ListBox = new CGUIListBox(Environment, this, -1, r, false, true, true);
		ListBox->setSubElement(true);
		ListBox->setNotClipped(true);
		ListBox->drop();

		// ensure that list box is always completely visible
		if (ListBox->getAbsolutePosition().LowerRightCorner.Y > Environment->getRootGUIElement()->getAbsolutePosition().getHeight())
			ListBox->setRelativePosition(core::rect<s32>(0, -ListBox->getAbsolutePosition().getHeight(), AbsoluteRect.getWidth(), 0));

		for (s32 i = 0; i < (s32)Items.size(); ++i)
			ListBox->addItem(Items[i].Name.c_str());

		ListBox->setSelected(Selected);

		// set focus
		Environment->setFocus(ListBox);
	}
}